

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureBufferActiveUniformValidation.cpp
# Opt level: O3

void __thiscall
glcts::TextureBufferActiveUniformValidation::initTest(TextureBufferActiveUniformValidation *this)

{
  int iVar1;
  deUint32 dVar2;
  GLuint *__s;
  GLuint *__s_00;
  undefined4 extraout_var;
  NotSupportedError *this_00;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  
  if ((this->super_TestCaseBase).m_is_texture_buffer_supported != false) {
    (*(this->super_TestCaseBase).super_TestCase.super_TestNode._vptr_TestNode[5])();
    lVar3 = (long)(this->m_texture_params).
                  super__Vector_base<glcts::TextureParameters,_std::allocator<glcts::TextureParameters>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(this->m_texture_params).
                  super__Vector_base<glcts::TextureParameters,_std::allocator<glcts::TextureParameters>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 4;
    uVar4 = lVar3 * -0x5555555555555554;
    uVar5 = -(ulong)((ulong)(lVar3 * -0x5555555555555555) >> 0x3e != 0) | uVar4;
    __s = (GLuint *)operator_new__(uVar5);
    this->m_tbo_tex_ids = __s;
    __s_00 = (GLuint *)operator_new__(uVar5);
    this->m_tbo_ids = __s_00;
    memset(__s,0,uVar4);
    memset(__s_00,0,uVar4);
    iVar1 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
    lVar3 = CONCAT44(extraout_var,iVar1);
    if ((this->m_texture_params).
        super__Vector_base<glcts::TextureParameters,_std::allocator<glcts::TextureParameters>_>.
        _M_impl.super__Vector_impl_data._M_finish !=
        (this->m_texture_params).
        super__Vector_base<glcts::TextureParameters,_std::allocator<glcts::TextureParameters>_>.
        _M_impl.super__Vector_impl_data._M_start) {
      iVar1 = 0x84c0;
      uVar4 = 0;
      do {
        (**(code **)(lVar3 + 0x6c8))(1,this->m_tbo_ids + uVar4);
        dVar2 = (**(code **)(lVar3 + 0x800))();
        glu::checkError(dVar2,"Error generating buffer object!",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferActiveUniformValidation.cpp"
                        ,0x7c);
        (**(code **)(lVar3 + 0x40))
                  ((this->super_TestCaseBase).m_glExtTokens.TEXTURE_BUFFER,this->m_tbo_ids[uVar4]);
        dVar2 = (**(code **)(lVar3 + 0x800))();
        glu::checkError(dVar2,"Error binding buffer object !",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferActiveUniformValidation.cpp"
                        ,0x7e);
        (**(code **)(lVar3 + 0x150))
                  ((this->super_TestCaseBase).m_glExtTokens.TEXTURE_BUFFER,
                   (this->m_texture_params).
                   super__Vector_base<glcts::TextureParameters,_std::allocator<glcts::TextureParameters>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar4].m_texture_buffer_size,0,0x88e8);
        dVar2 = (**(code **)(lVar3 + 0x800))();
        glu::checkError(dVar2,"Error allocating buffer object\'s data store!",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferActiveUniformValidation.cpp"
                        ,0x80);
        (**(code **)(lVar3 + 0x6f8))(1,this->m_tbo_tex_ids + uVar4);
        dVar2 = (**(code **)(lVar3 + 0x800))();
        glu::checkError(dVar2,"Error generating texture object!",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferActiveUniformValidation.cpp"
                        ,0x84);
        (**(code **)(lVar3 + 8))(iVar1);
        dVar2 = (**(code **)(lVar3 + 0x800))();
        glu::checkError(dVar2,"Error activating texture unit!",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferActiveUniformValidation.cpp"
                        ,0x86);
        (**(code **)(lVar3 + 0xb8))
                  ((this->super_TestCaseBase).m_glExtTokens.TEXTURE_BUFFER,
                   this->m_tbo_tex_ids[uVar4]);
        dVar2 = (**(code **)(lVar3 + 0x800))();
        glu::checkError(dVar2,"Error binding texture object!",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferActiveUniformValidation.cpp"
                        ,0x88);
        (**(code **)(lVar3 + 0x12f8))
                  ((this->super_TestCaseBase).m_glExtTokens.TEXTURE_BUFFER,
                   (this->m_texture_params).
                   super__Vector_base<glcts::TextureParameters,_std::allocator<glcts::TextureParameters>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar4].m_texture_format,
                   this->m_tbo_ids[uVar4]);
        dVar2 = (**(code **)(lVar3 + 0x800))();
        glu::checkError(dVar2,"Error setting buffer object as data store for texture buffer!",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferActiveUniformValidation.cpp"
                        ,0x8a);
        uVar4 = (ulong)(iVar1 - 0x84bf);
        uVar5 = ((long)(this->m_texture_params).
                       super__Vector_base<glcts::TextureParameters,_std::allocator<glcts::TextureParameters>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->m_texture_params).
                       super__Vector_base<glcts::TextureParameters,_std::allocator<glcts::TextureParameters>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x5555555555555555;
        iVar1 = iVar1 + 1;
      } while (uVar4 <= uVar5 && uVar5 - uVar4 != 0);
    }
    (*(this->super_TestCaseBase).super_TestCase.super_TestNode._vptr_TestNode[7])(this);
    return;
  }
  this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  tcu::NotSupportedError::NotSupportedError
            (this_00,"Texture buffer functionality not supported, skipping",
             fixed_sample_locations_values + 1,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferActiveUniformValidation.cpp"
             ,0x69);
  __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void TextureBufferActiveUniformValidation::initTest(void)
{
	/* Check if required extensions are supported */
	if (!m_is_texture_buffer_supported)
	{
		throw tcu::NotSupportedError(TEXTURE_BUFFER_EXTENSION_NOT_SUPPORTED, "", __FILE__, __LINE__);
	}

	/* Call specific implementation to configure texture params */
	configureParams(&m_texture_params);

	m_tbo_tex_ids = new glw::GLuint[m_texture_params.size()];
	m_tbo_ids	 = new glw::GLuint[m_texture_params.size()];

	memset(m_tbo_tex_ids, 0, m_texture_params.size() * sizeof(glw::GLuint));
	memset(m_tbo_ids, 0, m_texture_params.size() * sizeof(glw::GLuint));

	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Create buffers and textures */
	for (glw::GLuint i = 0; i < m_texture_params.size(); ++i)
	{
		/* Create buffer object*/
		gl.genBuffers(1, &m_tbo_ids[i]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Error generating buffer object!");
		gl.bindBuffer(m_glExtTokens.TEXTURE_BUFFER, m_tbo_ids[i]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Error binding buffer object !");
		gl.bufferData(m_glExtTokens.TEXTURE_BUFFER, m_texture_params[i].get_texture_buffer_size(), 0, GL_DYNAMIC_DRAW);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Error allocating buffer object's data store!");

		/* Create texture buffer */
		gl.genTextures(1, &m_tbo_tex_ids[i]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Error generating texture object!");
		gl.activeTexture(GL_TEXTURE0 + i);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Error activating texture unit!");
		gl.bindTexture(m_glExtTokens.TEXTURE_BUFFER, m_tbo_tex_ids[i]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Error binding texture object!");
		gl.texBuffer(m_glExtTokens.TEXTURE_BUFFER, m_texture_params[i].get_texture_format(), m_tbo_ids[i]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Error setting buffer object as data store for texture buffer!");
	}

	/* Create program */
	createProgram();
}